

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Intercom_Control_PDU::SetIntercomCommunicationParameters
          (Intercom_Control_PDU *this,
          vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
          *ICP)

{
  bool bVar1;
  KUINT16 KVar2;
  pointer this_00;
  __normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
  local_38;
  __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
  local_20;
  const_iterator citr;
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  *ICP_local;
  Intercom_Control_PDU *this_local;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x28;
  citr._M_current = (IntercomCommunicationParameters *)ICP;
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ::operator=(&this->m_vICP,ICP);
  citrEnd._M_current =
       (IntercomCommunicationParameters *)
       std::
       vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
       ::begin(&this->m_vICP);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_const*,std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>>
  ::__normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters*>
            ((__normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_const*,std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>>
              *)&local_20,
             (__normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
              *)&citrEnd);
  local_38._M_current =
       (IntercomCommunicationParameters *)
       std::
       vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
       ::end(&this->m_vICP);
  __gnu_cxx::
  __normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_const*,std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>>
  ::__normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters*>
            ((__normal_iterator<KDIS::DATA_TYPE::IntercomCommunicationParameters_const*,std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
              ::operator->(&local_20);
    KVar2 = DATA_TYPE::IntercomCommunicationParameters::GetLength(this_00);
    (this->super_Header).super_Header6.m_ui16PDULength =
         (this->super_Header).super_Header6.m_ui16PDULength + KVar2 + 4;
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::IntercomCommunicationParameters_*,_std::vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Intercom_Control_PDU::SetIntercomCommunicationParameters( const vector<IntercomCommunicationParameters> & ICP )
{
    m_ui16PDULength = INTERCOM_CONTROL_PDU_SIZE;

    m_vICP = ICP;

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();

    for( ; citr != citrEnd; ++citr )
    {
        // Calculate the PDU length.
        m_ui16PDULength += citr->GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    }
}